

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayoutitem.cpp
# Opt level: O0

QSize __thiscall QWidgetItemV2::sizeHint(QWidgetItemV2 *this)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  QWidgetItemV2 *in_RDI;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffffd8;
  QWidgetItemV2 *this_00;
  QSize local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uVar3 = (*(in_RDI->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[8])();
  if ((uVar3 & 1) == 0) {
    bVar2 = useSizeCache(in_RDI);
    if (bVar2) {
      updateCacheIfNecessary(this_00);
      local_10 = in_RDI->q_cachedSizeHint;
    }
    else {
      local_10 = QWidgetItem::sizeHint(&this_00->super_QWidgetItem);
    }
  }
  else {
    QSize::QSize((QSize *)in_RDI,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                 (int)in_stack_ffffffffffffffd8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

QSize QWidgetItemV2::sizeHint() const
{
    if (isEmpty())
        return QSize(0, 0);

    if (useSizeCache()) {
        updateCacheIfNecessary();
        return q_cachedSizeHint;
    } else {
        return QWidgetItem::sizeHint();
    }
}